

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

CMConnection INT_CMget_indexed_conn(CManager_conflict cm,int i)

{
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  char *__format;
  FILE *pFVar4;
  timespec ts;
  
  if ((i < 0) || (cm->connection_count <= i)) {
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(cm,CMConnectionVerbose);
      if (iVar1 == 0) goto LAB_0011981d;
    }
    else if (CMtrace_val[2] == 0) goto LAB_0011981d;
    if (CMtrace_PID != 0) {
      pFVar4 = (FILE *)cm->CMTrace_file;
      _Var2 = getpid();
      pVar3 = pthread_self();
      fprintf(pFVar4,"P%lxT%lx - ",(long)_Var2,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    pFVar4 = (FILE *)cm->CMTrace_file;
    __format = "Invalid index. i=%d. INT_CMget_indexed_conn\n";
  }
  else {
    if (cm->connections[(uint)i] != (CMConnection)0x0) {
      return cm->connections[(uint)i];
    }
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(cm,CMConnectionVerbose);
      if (iVar1 == 0) goto LAB_0011981d;
    }
    else if (CMtrace_val[2] == 0) goto LAB_0011981d;
    if (CMtrace_PID != 0) {
      pFVar4 = (FILE *)cm->CMTrace_file;
      _Var2 = getpid();
      pVar3 = pthread_self();
      fprintf(pFVar4,"P%lxT%lx - ",(long)_Var2,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    pFVar4 = (FILE *)cm->CMTrace_file;
    __format = "cm->connection[%d] is NULL. INT_CMget_indexed_conn\n";
  }
  fprintf(pFVar4,__format,(ulong)(uint)i);
LAB_0011981d:
  fflush((FILE *)cm->CMTrace_file);
  return (CMConnection)0x0;
}

Assistant:

extern CMConnection 
 INT_CMget_indexed_conn(CManager cm, int i)
 {
     if (i>=0 && i<cm->connection_count) {
	 if (cm->connections[i] != NULL) {
	     return cm->connections[i];
	 } else {
	     CMtrace_out(cm, CMConnectionVerbose,
			 "cm->connection[%d] is NULL. INT_CMget_indexed_conn\n", i);
	     return NULL;
	 }
     } else {
	 CMtrace_out(cm, CMConnectionVerbose,
		     "Invalid index. i=%d. INT_CMget_indexed_conn\n", i);
	 return NULL;
     }
 }